

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

bool __thiscall MakefileGenerator::canExecute(MakefileGenerator *this,QStringList *cmdline,int *a)

{
  QString *pQVar1;
  QString string;
  QString file;
  char cVar2;
  bool bVar3;
  qsizetype qVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  QArrayData *pQVar8;
  QArrayData *pQVar9;
  char16_t *pcVar10;
  undefined1 *puVar11;
  QStringView local_58;
  undefined1 *local_48;
  SourceFiles *local_38;
  
  local_38 = *(SourceFiles **)(in_FS_OFFSET + 0x28);
  iVar5 = -1;
  if ((cmdline->d).size != 0) {
    lVar7 = 0x10;
    uVar6 = 0;
    do {
      pQVar1 = (cmdline->d).ptr;
      local_58.m_data = *(storage_type_conflict **)((long)pQVar1 + lVar7 + -8);
      local_58.m_size = *(undefined8 *)((long)&(pQVar1->d).d + lVar7);
      qVar4 = QStringView::indexOf(&local_58,(QChar)0x3d,0,CaseSensitive);
      if (qVar4 == -1) {
        iVar5 = (int)uVar6;
        break;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x18;
    } while (uVar6 < (ulong)(cmdline->d).size);
  }
  if (a != (int *)0x0) {
    *a = iVar5;
  }
  if (iVar5 != -1) {
    puVar11 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcVar10 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (cmdline->d).ptr;
    local_58.m_size = (qsizetype)pQVar1[iVar5].d.d;
    local_58.m_data = pQVar1[iVar5].d.ptr;
    local_48 = (undefined1 *)pQVar1[iVar5].d.size;
    if ((QArrayData *)local_58.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_58.m_size)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_58.m_size)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    Option::fixString((QString *)&stack0xffffffffffffff88,string,(uchar)&local_58);
    if ((QArrayData *)local_58.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58.m_size,2,0x10);
      }
    }
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    file.d.ptr = pcVar10;
    file.d.d = (Data *)pQVar8;
    file.d.size = (qsizetype)puVar11;
    pQVar9 = pQVar8;
    local_58.m_size = (qsizetype)pQVar8;
    local_58.m_data = pcVar10;
    local_48 = puVar11;
    fileInfo((MakefileGenerator *)&stack0xffffffffffffffc0,file);
    cVar2 = QFileInfo::exists();
    QFileInfo::~QFileInfo((QFileInfo *)&stack0xffffffffffffffc0);
    if ((QArrayData *)local_58.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58.m_size,2,0x10);
      }
    }
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar8,2,0x10);
      }
    }
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar9,2,0x10);
      }
    }
    bVar3 = true;
    if (cVar2 != '\0') goto LAB_00155f35;
  }
  bVar3 = false;
LAB_00155f35:
  if (*(SourceFiles **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool MakefileGenerator::canExecute(const QStringList &cmdline, int *a) const
{
    int argv0 = -1;
    for(int i = 0; i < cmdline.size(); ++i) {
        if(!cmdline.at(i).contains('=')) {
            argv0 = i;
            break;
        }
    }
    if(a)
        *a = argv0;
    if(argv0 != -1) {
        const QString c = Option::normalizePath(cmdline.at(argv0));
        if(exists(c))
            return true;
    }
    return false;
}